

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          string *propName,aiTextureType target,MeshGeometry *mesh)

{
  long lVar1;
  long lVar2;
  Texture *tex;
  PropertyTable *this_00;
  pointer ppaVar3;
  _Alloc_hider _Var4;
  int iVar5;
  uint uVar6;
  const_iterator cVar7;
  Property *pPVar8;
  long lVar9;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var10
  ;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar11;
  long *plVar12;
  MeshGeometry *pMVar13;
  MatIndexArray *pMVar14;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  _Rb_tree_node_base *p_Var16;
  undefined8 *puVar17;
  size_type *psVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  int uvIndex;
  uint matIndex;
  int blendmode;
  aiString path;
  uint local_674;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  FBXConverter *local_610;
  aiMaterial *local_608;
  ulong local_600;
  aiTextureType local_5f8;
  undefined4 local_5f4;
  _Rb_tree_node_base *local_5f0;
  _Base_ptr local_5e8;
  MeshGeometry *local_5e0;
  ulong local_5d8;
  undefined4 local_5cc;
  aiVector2D local_5c8;
  aiVector2D aStack_5c0;
  undefined4 local_5b8;
  string local_5b0 [3];
  ios_base local_540 [268];
  aiString local_434;
  
  local_610 = this;
  local_608 = out_mat;
  local_5e0 = mesh;
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
          ::find(&layeredTextures->_M_t,propName);
  if ((_Rb_tree_header *)cVar7._M_node != &(layeredTextures->_M_t)._M_impl.super__Rb_tree_header) {
    lVar9 = *(long *)(cVar7._M_node + 2);
    lVar1 = *(long *)(lVar9 + 0x40);
    lVar2 = *(long *)(lVar9 + 0x38);
    local_5cc = *(undefined4 *)(lVar9 + 0x50);
    aiMaterial::AddBinaryProperty(out_mat,&local_5cc,4,"$tex.op",target,0,aiPTI_Integer);
    uVar20 = (uint)((ulong)(lVar1 - lVar2) >> 3);
    if (0 < (int)uVar20) {
      local_5f0 = &(local_610->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_600 = (ulong)(uVar20 & 0x7fffffff);
      uVar19 = 0;
      local_5f8 = target;
      local_5e8 = cVar7._M_node;
      do {
        tex = *(Texture **)(*(long *)(*(long *)(cVar7._M_node + 2) + 0x38) + uVar19 * 8);
        GetTexturePath(&local_434,local_610,tex);
        aiMaterial::AddProperty(local_608,&local_434,"$tex.file",target,(uint)uVar19);
        local_5b8 = 0;
        local_5c8 = tex->uvTrans;
        aStack_5c0 = tex->uvScaling;
        local_5d8 = uVar19;
        aiMaterial::AddBinaryProperty
                  (local_608,&local_5c8,0x14,"$tex.uvtrafo",target,(uint)uVar19,aiPTI_Float);
        this_00 = (tex->props).
                  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (this_00 == (PropertyTable *)0x0) {
          __assert_fail("props.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.h"
                        ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
        }
        local_674 = 0;
        local_5b0[0]._M_dataplus._M_p = (pointer)&local_5b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"UVSet","");
        pPVar8 = PropertyTable::Get(this_00,local_5b0);
        if ((pPVar8 == (Property *)0x0) ||
           (lVar9 = __dynamic_cast(pPVar8,&Property::typeinfo,
                                   &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar9 == 0)) {
          local_650._M_string_length = 0;
          local_650.field_2._M_local_buf[0] = '\0';
          bVar22 = false;
          local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        }
        else {
          bVar22 = true;
          local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_650,*(long *)(lVar9 + 8),
                     *(long *)(lVar9 + 0x10) + *(long *)(lVar9 + 8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if (((bVar22) && (iVar5 = std::__cxx11::string::compare((char *)&local_650), iVar5 != 0)) &&
           (local_650._M_string_length != 0)) {
          ppaVar3 = (local_610->materials).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                             (ppaVar3,(local_610->materials).
                                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,&local_608);
          pMVar13 = local_5e0;
          local_5f4 = (undefined4)((ulong)((long)_Var10._M_current - (long)ppaVar3) >> 3);
          local_674 = 0xffffffff;
          if (local_5e0 == (MeshGeometry *)0x0) {
            p_Var16 = (local_610->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            if (p_Var16 != local_5f0) {
              do {
                uVar20 = local_674;
                if ((*(long *)(p_Var16 + 1) != 0) &&
                   (pMVar13 = (MeshGeometry *)
                              __dynamic_cast(*(long *)(p_Var16 + 1),&Geometry::typeinfo,
                                             &MeshGeometry::typeinfo,0), uVar20 = local_674,
                   pMVar13 != (MeshGeometry *)0x0)) {
                  pMVar14 = MeshGeometry::GetMaterialIndices(pMVar13);
                  _Var15 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     ((pMVar14->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (pMVar14->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,&local_5f4);
                  uVar20 = local_674;
                  if (_Var15._M_current !=
                      (pMVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
                    uVar20 = 0xffffffff;
                    uVar6 = 0;
                    do {
                      pvVar11 = MeshGeometry::GetTextureCoords(pMVar13,uVar6);
                      if ((pvVar11->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start ==
                          (pvVar11->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_(local_5b0,pMVar13,uVar6);
                      _Var4._M_p = local_5b0[0]._M_dataplus._M_p;
                      if (local_5b0[0]._M_string_length == local_650._M_string_length) {
                        if (local_5b0[0]._M_string_length == 0) {
                          bVar22 = false;
                          uVar20 = uVar6;
                        }
                        else {
                          iVar5 = bcmp(local_5b0[0]._M_dataplus._M_p,local_650._M_dataplus._M_p,
                                       local_5b0[0]._M_string_length);
                          bVar22 = iVar5 != 0;
                          if (!bVar22) {
                            uVar20 = uVar6;
                          }
                        }
                      }
                      else {
                        bVar22 = true;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var4._M_p != &local_5b0[0].field_2) {
                        operator_delete(_Var4._M_p,local_5b0[0].field_2._M_allocated_capacity + 1);
                      }
                      bVar21 = uVar6 < 7;
                      uVar6 = uVar6 + 1;
                    } while ((bool)(bVar22 & bVar21));
                    if (uVar20 == 0xffffffff) {
                      std::operator+(&local_630,"did not find UV channel named ",&local_650);
                      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_630);
                      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
                      psVar18 = puVar17 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar17 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_670.field_2._M_allocated_capacity = *psVar18;
                        local_670.field_2._8_8_ = puVar17[3];
                      }
                      else {
                        local_670.field_2._M_allocated_capacity = *psVar18;
                        local_670._M_dataplus._M_p = (pointer)*puVar17;
                      }
                      local_670._M_string_length = puVar17[1];
                      *puVar17 = psVar18;
                      puVar17[1] = 0;
                      *(undefined1 *)(puVar17 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_670);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    else {
                      if (local_674 == 0xffffffff) goto LAB_005a3c57;
                      std::operator+(&local_630,"the UV channel named ",&local_650);
                      plVar12 = (long *)std::__cxx11::string::append((char *)&local_630);
                      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
                      psVar18 = (size_type *)(plVar12 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar12 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_670.field_2._M_allocated_capacity = *psVar18;
                        local_670.field_2._8_8_ = plVar12[3];
                      }
                      else {
                        local_670.field_2._M_allocated_capacity = *psVar18;
                        local_670._M_dataplus._M_p = (pointer)*plVar12;
                      }
                      local_670._M_string_length = plVar12[1];
                      *plVar12 = (long)psVar18;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_670);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
                    std::ios_base::~ios_base(local_540);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_670._M_dataplus._M_p != &local_670.field_2) {
                      operator_delete(local_670._M_dataplus._M_p,
                                      local_670.field_2._M_allocated_capacity + 1);
                    }
                    uVar20 = local_674;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_630._M_dataplus._M_p != &local_630.field_2) {
                      operator_delete(local_630._M_dataplus._M_p,
                                      local_630.field_2._M_allocated_capacity + 1);
                      uVar20 = local_674;
                    }
                  }
                }
LAB_005a3c57:
                local_674 = uVar20;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                uVar20 = local_674;
              } while (p_Var16 != local_5f0);
              goto LAB_005a3d0f;
            }
LAB_005a3d18:
            std::operator+(&local_630,"failed to resolve UV channel ",&local_650);
            puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_630);
            psVar18 = puVar17 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_670.field_2._M_allocated_capacity = *psVar18;
              local_670.field_2._8_8_ = puVar17[3];
              local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
            }
            else {
              local_670.field_2._M_allocated_capacity = *psVar18;
              local_670._M_dataplus._M_p = (pointer)*puVar17;
            }
            local_670._M_string_length = puVar17[1];
            *puVar17 = psVar18;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_5b0,&local_670);
            LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
            std::ios_base::~ios_base(local_540);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_670._M_dataplus._M_p != &local_670.field_2) {
              operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_630._M_dataplus._M_p != &local_630.field_2) {
              operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1
                             );
            }
            local_674 = 0;
            cVar7._M_node = local_5e8;
            target = local_5f8;
          }
          else {
            uVar20 = 0xffffffff;
            uVar6 = 0;
            do {
              pvVar11 = MeshGeometry::GetTextureCoords(pMVar13,uVar6);
              if ((pvVar11->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar11->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_(local_5b0,pMVar13,uVar6);
              _Var4._M_p = local_5b0[0]._M_dataplus._M_p;
              if (local_5b0[0]._M_string_length == local_650._M_string_length) {
                if (local_5b0[0]._M_string_length == 0) {
                  bVar22 = false;
                  uVar20 = uVar6;
                }
                else {
                  iVar5 = bcmp(local_5b0[0]._M_dataplus._M_p,local_650._M_dataplus._M_p,
                               local_5b0[0]._M_string_length);
                  bVar22 = iVar5 != 0;
                  if (!bVar22) {
                    uVar20 = uVar6;
                  }
                }
              }
              else {
                bVar22 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var4._M_p != &local_5b0[0].field_2) {
                operator_delete(_Var4._M_p,local_5b0[0].field_2._M_allocated_capacity + 1);
              }
              bVar21 = uVar6 < 7;
              uVar6 = uVar6 + 1;
            } while ((bool)(bVar22 & bVar21));
            if (uVar20 == 0xffffffff) {
              std::operator+(&local_630,"did not find UV channel named ",&local_650);
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_630);
              local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
              psVar18 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_670.field_2._M_allocated_capacity = *psVar18;
                local_670.field_2._8_8_ = plVar12[3];
              }
              else {
                local_670.field_2._M_allocated_capacity = *psVar18;
                local_670._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_670._M_string_length = plVar12[1];
              *plVar12 = (long)psVar18;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5b0,&local_670);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
              std::ios_base::~ios_base(local_540);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p != &local_670.field_2) {
                operator_delete(local_670._M_dataplus._M_p,
                                local_670.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_630._M_dataplus._M_p != &local_630.field_2) {
                operator_delete(local_630._M_dataplus._M_p,
                                local_630.field_2._M_allocated_capacity + 1);
              }
            }
            cVar7._M_node = local_5e8;
            target = local_5f8;
            if (local_674 == 0xffffffff) {
LAB_005a3d0f:
              local_674 = uVar20;
              cVar7._M_node = local_5e8;
              target = local_5f8;
              if (local_674 == 0xffffffff) goto LAB_005a3d18;
            }
          }
        }
        uVar19 = local_5d8;
        aiMaterial::AddBinaryProperty
                  (local_608,&local_674,4,"$tex.uvwsrc",target,(uint)local_5d8,aiPTI_Integer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,
                          CONCAT71(local_650.field_2._M_allocated_capacity._1_7_,
                                   local_650.field_2._M_local_buf[0]) + 1);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_600);
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures,
            const std::string& propName,
            aiTextureType target, const MeshGeometry* const mesh) {
            LayeredTextureMap::const_iterator it = layeredTextures.find(propName);
            if (it == layeredTextures.end()) {
                return;
            }

            int texCount = (*it).second->textureCount();

            // Set the blend mode for layered textures
            int blendmode = (*it).second->GetBlendMode();
            out_mat->AddProperty(&blendmode, 1, _AI_MATKEY_TEXOP_BASE, target, 0);

            for (int texIndex = 0; texIndex < texCount; texIndex++) {

                const Texture* const tex = (*it).second->getTexture(texIndex);

                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, texIndex);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, texIndex);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));

                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, texIndex);
            }
        }